

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O3

Configuration * __thiscall Clasp::Cli::ClaspCliConfig::config(ClaspCliConfig *this,char *n)

{
  int iVar1;
  Configuration *pCVar2;
  UserConfig *pUVar3;
  
  if (n != (char *)0x0) {
    iVar1 = strcmp(n,"tester");
    if (iVar1 == 0) {
      pUVar3 = (this->super_ClaspConfig).tester_;
      if (pUVar3 == (UserConfig *)0x0) {
        setAppOpt(this,0x49,'\0',"");
        pUVar3 = (this->super_ClaspConfig).tester_;
      }
      return (Configuration *)pUVar3;
    }
  }
  pCVar2 = ClaspConfig::config(&this->super_ClaspConfig,n);
  return pCVar2;
}

Assistant:

Configuration* ClaspCliConfig::config(const char* n) {
	if (n && std::strcmp(n, "tester") == 0) {
		if (!testerConfig()) {
			setAppOpt(meta_tester, 0, "");
		}
		return testerConfig();
	}
	return ClaspConfig::config(n);
}